

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O0

bool __thiscall ON_SubDComponentRef::IsValid(ON_SubDComponentRef *this,ON_TextLog *text_log)

{
  bool bVar1;
  ON_SubD *this_00;
  bool local_19;
  ON_TextLog *text_log_local;
  ON_SubDComponentRef *this_local;
  
  bVar1 = ON_SubDComponentPtr::IsNotNull(&this->m_component_ptr);
  local_19 = false;
  if ((bVar1) &&
     ((this->m_component_location == ControlNet ||
      (local_19 = false, this->m_component_location == Surface)))) {
    this_00 = SubD(this);
    local_19 = ON_SubD::IsEmpty(this_00);
    local_19 = !local_19;
  }
  return local_19;
}

Assistant:

bool ON_SubDComponentRef::IsValid(ON_TextLog* text_log) const
{
  return (
    m_component_ptr.IsNotNull() 
    && (ON_SubDComponentLocation::ControlNet == m_component_location || ON_SubDComponentLocation::Surface == m_component_location)
    && false == SubD().IsEmpty()
    );
}